

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O3

float sum(string *file_name)

{
  long lVar1;
  runtime_error *this;
  long *plVar2;
  long *plVar3;
  float fVar4;
  ifstream ifs;
  undefined1 auStack_298 [4];
  float local_294;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long local_230 [3];
  byte abStack_214 [4];
  uint auStack_210 [122];
  
  std::ifstream::ifstream(local_230,(string *)file_name,_S_in);
  lVar1 = *(long *)(local_230[0] + -0x18);
  if ((*(uint *)((long)auStack_210 + lVar1) & 5) == 0) {
    abStack_214[lVar1] = abStack_214[lVar1] | 1;
    std::ios::clear((int)auStack_298 + (int)lVar1 + 0x68);
    local_294 = 0.0;
    if ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] + -0x18)) & 2) == 0) {
      local_294 = 0.0;
      do {
        fVar4 = read_int((istream *)local_230);
        local_294 = local_294 + fVar4;
      } while ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] + -0x18)) & 2) == 0);
    }
    std::ifstream::~ifstream(local_230);
    return local_294;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_290,"Could not open \'",file_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_270 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_270 == plVar3) {
    local_260 = *plVar3;
    lStack_258 = plVar2[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar3;
  }
  local_268 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_270);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float sum(const std::string& file_name)
{
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		throw std::runtime_error("Could not open '" +
			file_name + "' for reading.");
	}
	ifs.exceptions(ifs.exceptions()|std::ios_base::badbit);
	float sum{ 0 };
	try
	{
		while (!ifs.eof())
		{
			sum += read_int(ifs);
		}
	}
	catch (const std::exception& e)
	{
		throw std::runtime_error("Found bad symbol in file '" + file_name
			+ "'. " + e.what());
	}
	return sum;
}